

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O3

OPNMIDI_VolumeModels __thiscall OPN2::getVolumeScaleModel(OPN2 *this)

{
  OPNMIDI_VolumeModels OVar1;
  
  OVar1 = OPNMIDI_VolumeModel_Generic;
  if (this->m_volumeScale - VOLUME_NATIVE < 4) {
    OVar1 = this->m_volumeScale + VOLUME_NATIVE;
  }
  return OVar1;
}

Assistant:

OPNMIDI_VolumeModels OPN2::getVolumeScaleModel()
{
    switch(m_volumeScale)
    {
    default:
    case OPN2::VOLUME_Generic:
        return OPNMIDI_VolumeModel_Generic;
    case OPN2::VOLUME_NATIVE:
        return OPNMIDI_VolumeModel_NativeOPN2;
    case OPN2::VOLUME_DMX:
        return OPNMIDI_VolumeModel_DMX;
    case OPN2::VOLUME_APOGEE:
        return OPNMIDI_VolumeModel_APOGEE;
    case OPN2::VOLUME_9X:
        return OPNMIDI_VolumeModel_9X;
    }
}